

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLEntityDecl.cpp
# Opt level: O3

XProtoType * __thiscall xercesc_4_0::XMLEntityDecl::getProtoType(XMLEntityDecl *this)

{
  return (XProtoType *)classXMLEntityDecl;
}

Assistant:

void XMLEntityDecl::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng.writeSize (fId);
        serEng.writeSize (fValueLen);
        serEng.writeString(fValue);
        serEng.writeString(fName);
        serEng.writeString(fNotationName);
        serEng.writeString(fPublicId);
        serEng.writeString(fSystemId);
        serEng.writeString(fBaseURI);
        serEng<<fIsExternal;
    }
    else
    {
        serEng.readSize (fId);
        serEng.readSize (fValueLen);
        serEng.readString(fValue);
        serEng.readString(fName);
        serEng.readString(fNotationName);
        serEng.readString(fPublicId);
        serEng.readString(fSystemId);
        serEng.readString(fBaseURI);
        serEng>>fIsExternal;
    }
}